

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O1

_Bool is_close_frame(uint16_t status_code,_Bool status_code_required)

{
  size_t sVar1;
  uint16_t *puVar2;
  byte bVar3;
  size_t sVar4;
  uint uVar5;
  ulong uVar7;
  uint8_t *puVar8;
  ulong uVar9;
  uint uVar10;
  long lVar12;
  ulong uVar13;
  undefined4 local_14;
  ulong uStack_10;
  uint8_t mask [4];
  uint_fast32_t aligned_mask;
  ulong uVar6;
  ulong uVar11;
  
  sVar4 = write_buffer_parse_pos;
  sVar1 = write_buffer_parse_pos;
  if (((char)write_buffer[write_buffer_parse_pos] < '\0') &&
     (sVar1 = write_buffer_parse_pos + 1, (write_buffer[write_buffer_parse_pos] & 8) != 0)) {
    uVar5 = write_buffer[write_buffer_parse_pos + 1] & 0x7f;
    uVar6 = (ulong)uVar5;
    bVar3 = (byte)uVar5;
    sVar1 = write_buffer_parse_pos + 2;
    if (0x83 < (byte)(bVar3 + 0x82)) {
      if ((char)write_buffer[write_buffer_parse_pos + 1] < '\0') {
        puVar8 = write_buffer + write_buffer_parse_pos + 6;
        local_14 = *(undefined4 *)(write_buffer + write_buffer_parse_pos + 2);
        sVar1 = write_buffer_parse_pos + 6;
        uStack_10 = 0;
        if (bVar3 < 8) {
          if (bVar3 != 0) {
            uVar7 = 0;
            write_buffer_parse_pos = sVar1;
            do {
              puVar8[uVar7] = puVar8[uVar7] ^ *(byte *)((long)&local_14 + (ulong)((uint)uVar7 & 3));
              uVar7 = uVar7 + 1;
              sVar1 = write_buffer_parse_pos;
            } while (uVar6 != uVar7);
          }
        }
        else {
          uVar10 = -(int)puVar8 & 7;
          uVar11 = (ulong)uVar10;
          uVar7 = uVar6 - uVar11;
          lVar12 = 0;
          do {
            *(undefined1 *)((long)&stack0xfffffffffffffff0 + lVar12) =
                 *(undefined1 *)
                  ((long)&local_14 +
                  (ulong)((-0x160c66 - (int)write_buffer_parse_pos) + (int)lVar12 & 3));
            lVar12 = lVar12 + 1;
          } while (lVar12 != 8);
          uVar9 = (ulong)((uint)uVar7 & 7);
          write_buffer_parse_pos = sVar1;
          if (uVar11 != 0) {
            lVar12 = 0;
            do {
              puVar8[lVar12] =
                   puVar8[lVar12] ^ *(byte *)((long)&local_14 + (ulong)((uint)lVar12 & 3));
              lVar12 = lVar12 + 1;
            } while (uVar10 != (uint)lVar12);
          }
          if (7 < uVar7) {
            uVar13 = 0;
            do {
              *(ulong *)(puVar8 + uVar13 * 8 + uVar11) =
                   *(ulong *)(puVar8 + uVar13 * 8 + uVar11) ^ uStack_10;
              uVar13 = uVar13 + 1;
            } while (uVar7 >> 3 != uVar13);
          }
          sVar1 = write_buffer_parse_pos;
          if (uVar6 - uVar9 < uVar6) {
            lVar12 = -uVar9;
            do {
              write_buffer[lVar12 + sVar4 + uVar6 + 6] =
                   write_buffer[lVar12 + sVar4 + uVar6 + 6] ^
                   *(byte *)((long)&local_14 + (ulong)(uVar5 + (int)lVar12 & 3));
              lVar12 = lVar12 + 1;
              sVar1 = write_buffer_parse_pos;
            } while (lVar12 != 0);
          }
        }
      }
      write_buffer_parse_pos = sVar1;
      puVar2 = (uint16_t *)(write_buffer + write_buffer_parse_pos);
      write_buffer_parse_pos = (uVar5 - 2 & 0xff) + write_buffer_parse_pos + 2;
      return *puVar2 == status_code;
    }
  }
  write_buffer_parse_pos = sVar1;
  return false;
}

Assistant:

static bool is_close_frame(uint16_t status_code, bool status_code_required)
{
	if ((write_buffer[write_buffer_parse_pos] & WS_HEADER_FIN) != WS_HEADER_FIN) {
		return false;
	}

	if ((write_buffer[write_buffer_parse_pos++] & WS_CLOSE_FRAME) == 0) {
		return false;
	}

	uint8_t first_length = write_buffer[write_buffer_parse_pos++];
	bool is_masked = ((first_length & WS_MASK_SET) == WS_MASK_SET);
	first_length = first_length & (uint8_t)~WS_MASK_SET;
	if (first_length > CIO_WEBSOCKET_SMALL_FRAME_SIZE) {
		return false;
	}

	if ((first_length == 0) && (status_code_required)) {
		return false;
	}

	if (first_length == 1) {
		return false;
	}

	if (first_length > 0) {
		if (is_masked) {
			uint8_t mask[4];
			memcpy(mask, &write_buffer[write_buffer_parse_pos], sizeof(mask));
			write_buffer_parse_pos += sizeof(mask);
			cio_websocket_mask(&write_buffer[write_buffer_parse_pos], first_length, mask);
		}

		uint16_t sc;
		memcpy(&sc, &write_buffer[write_buffer_parse_pos], sizeof(sc));
		sc = cio_be16toh(sc);
		write_buffer_parse_pos += sizeof(sc);
		first_length = (uint8_t)(first_length - sizeof(sc));
		write_buffer_parse_pos += first_length;
		if (status_code != sc) {
			return false;
		}
	}

	return true;
}